

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SizeTest_Test::TestBody(ConfidentialTransaction_SizeTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_318;
  Message local_310;
  uint32_t local_308 [2];
  undefined1 local_300 [8];
  AssertionResult gtest_ar_11;
  Message local_2e8;
  uint32_t local_2e0 [2];
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_10;
  Message local_2c0;
  uint32_t local_2b8 [2];
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_9;
  Message local_298;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  undefined1 local_228 [8];
  Amount amt;
  int64_t exp_satoshi;
  Message local_208;
  uint32_t local_200 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_7;
  Message local_1e0;
  uint32_t local_1d8 [2];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_6;
  Message local_1b8;
  uint32_t local_1b0 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_5;
  Message local_190;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  Message local_150;
  uint32_t local_148 [2];
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Message local_128;
  uint32_t local_120 [2];
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  uint32_t local_f8 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_90 [8];
  ConfidentialTransaction tx;
  ConfidentialTransaction empty_tx;
  ConfidentialTransaction_SizeTest_Test *this_local;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2,0);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction((ConfidentialTransaction *)local_90);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)local_90,
             (ConfidentialTransaction *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_d0,(AbstractTransaction *)local_90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b0,"\"0200000000000000000000\"","tx.GetHex().c_str()",
             "0200000000000000000000",pcVar2);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_f8[1] = 0xb;
  local_f8[0] = cfd::core::ConfidentialTransaction::GetTotalSize
                          ((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_f0,"11","tx.GetTotalSize()",(int *)(local_f8 + 1),local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_120[1] = 0xb;
  local_120[0] = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_118,"11","tx.GetVsize()",(int *)(local_120 + 1),local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_148[1] = 0x2c;
  local_148[0] = cfd::core::ConfidentialTransaction::GetWeight((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_140,"44","tx.GetWeight()",(int *)(local_148 + 1),local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  cfd::core::ConfidentialTransaction::AddTxIn
            ((ConfidentialTransaction *)local_90,&exp_txid,2,0xfffffffe,
             (Script *)cfd::core::Script::Empty);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_188,(AbstractTransaction *)local_90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,
             "\"020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000\""
             ,"tx.GetHex().c_str()",
             "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1b0[1] = 0x34;
  local_1b0[0] = cfd::core::ConfidentialTransaction::GetTotalSize
                           ((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_1a8,"52","tx.GetTotalSize()",(int *)(local_1b0 + 1),local_1b0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1d8[1] = 0x34;
  local_1d8[0] = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_1d0,"52","tx.GetVsize()",(int *)(local_1d8 + 1),local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_200[1] = 0xd0;
  local_200[0] = cfd::core::ConfidentialTransaction::GetWeight((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_1f8,"208","tx.GetWeight()",(int *)(local_200 + 1),local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_satoshi,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_satoshi,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_satoshi);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)local_90,
             (ConfidentialTransaction *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  amt.ignore_check_ = true;
  amt._9_7_ = 0xbc61;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_228 = (undefined1  [8])AVar3.amount_;
  amt.amount_._0_1_ = AVar3.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_8.message_,&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTransaction::AddTxOut
            ((ConfidentialTransaction *)local_90,(Amount *)local_228,
             (ConfidentialAssetId *)&gtest_ar_8.message_,&exp_locking_script);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_290,(AbstractTransaction *)local_90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_270,
             "\"0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000\""
             ,"tx.GetHex().c_str()",
             "0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2b8[1] = 0x50;
  local_2b8[0] = cfd::core::ConfidentialTransaction::GetTotalSize
                           ((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_2b0,"80","tx.GetTotalSize()",(int *)(local_2b8 + 1),local_2b8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_2e0[1] = 0x50;
  local_2e0[0] = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_2d8,"80","tx.GetVsize()",(int *)(local_2e0 + 1),local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_308[1] = 0x140;
  local_308[0] = cfd::core::ConfidentialTransaction::GetWeight((ConfidentialTransaction *)local_90);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_300,"320","tx.GetWeight()",(int *)(local_308 + 1),local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_8.message_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_90);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SizeTest) {
  ConfidentialTransaction empty_tx(2, 0);
  ConfidentialTransaction tx;
  tx = empty_tx;
  EXPECT_STREQ("0200000000000000000000", tx.GetHex().c_str());
  EXPECT_EQ(11, tx.GetTotalSize());
  EXPECT_EQ(11, tx.GetVsize());
  EXPECT_EQ(44, tx.GetWeight());

  tx.AddTxIn(exp_txid, exp_index, exp_sequence);
  EXPECT_STREQ("020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000", tx.GetHex().c_str());
  EXPECT_EQ(52, tx.GetTotalSize());
  EXPECT_EQ(52, tx.GetVsize());
  EXPECT_EQ(208, tx.GetWeight());

  tx = empty_tx;
  int64_t exp_satoshi = 12345678;
  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  tx.AddTxOut(amt, asset, exp_locking_script);
  EXPECT_STREQ("0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000", tx.GetHex().c_str());
  EXPECT_EQ(80, tx.GetTotalSize());
  EXPECT_EQ(80, tx.GetVsize());
  EXPECT_EQ(320, tx.GetWeight());
}